

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::AssertionHandler::handleExpr<int_const&>(AssertionHandler *this,ExprLhs<const_int_&> *expr)

{
  ITransientExpression local_20;
  int *local_10;
  
  local_10 = expr->m_lhs;
  local_20.m_result = *local_10 != 0;
  local_20.m_isBinaryExpression = false;
  local_20._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c6078;
  handleExpr(this,&local_20);
  ITransientExpression::~ITransientExpression(&local_20);
  return;
}

Assistant:

auto makeUnaryExpr() const -> UnaryExpr<LhsT> {
            return UnaryExpr<LhsT>{ m_lhs };
        }